

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# best_constant.cc
# Opt level: O0

bool get_best_constant(vw *all,float *best_constant,float *best_constant_loss)

{
  long *plVar1;
  byte bVar2;
  int iVar3;
  float *in_RDX;
  float *in_RSI;
  long *in_RDI;
  float fVar4;
  double dVar5;
  float q;
  float tau;
  string funcName;
  float label2_cnt;
  float label1_cnt;
  float tmp;
  float label2;
  float label1;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  float local_104;
  string *key;
  undefined7 in_stack_ffffffffffffff20;
  float local_c4;
  undefined1 local_b9 [40];
  allocator local_91;
  string local_90 [32];
  float local_70;
  undefined4 local_5c;
  string local_58 [36];
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float *local_20;
  float *local_18;
  long *local_10;
  byte local_1;
  
  if ((((*(float *)(*in_RDI + 0xd4) == 3.4028235e+38) && (!NAN(*(float *)(*in_RDI + 0xd4)))) ||
      (in_RDI[0x6a9] == 0)) || (*in_RDI == 0)) {
    local_1 = 0;
    goto LAB_0031913c;
  }
  fVar4 = *(float *)(*in_RDI + 0xd4);
  if ((*(float *)(*in_RDI + 0xd8) != 3.4028235e+38) || (NAN(*(float *)(*in_RDI + 0xd8)))) {
    local_c4 = *(float *)(*in_RDI + 0xd8);
  }
  else {
    local_c4 = 0.0;
  }
  local_28 = local_c4;
  local_24 = fVar4;
  if (local_c4 < fVar4) {
    local_24 = local_c4;
    local_2c = fVar4;
    local_28 = fVar4;
  }
  if ((local_24 == local_28) && (!NAN(local_24) && !NAN(local_28))) {
    local_1 = 0;
    goto LAB_0031913c;
  }
  local_30 = (float)(-(double)local_28 * *(double *)(*in_RDI + 0x20) + *(double *)(*in_RDI + 0x38))
             / (local_24 - local_28);
  local_34 = (float)*(double *)(*in_RDI + 0x20) - local_30;
  if (local_30 + local_34 <= 0.0) {
    local_1 = 0;
    goto LAB_0031913c;
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  (*(code *)**(undefined8 **)in_RDI[0x6a9])(local_58);
  iVar3 = std::__cxx11::string::compare((char *)local_58);
  if (((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_58), iVar3 == 0)) ||
     (iVar3 = std::__cxx11::string::compare((char *)local_58), iVar3 == 0)) {
    *local_18 = (float)*(double *)(*local_10 + 0x38) / (float)*(double *)(*local_10 + 0x20);
LAB_00318fb9:
    if ((*(byte *)(*local_10 + 0xd0) & 1) == 0) {
      if (local_30 <= 0.0) {
        local_104 = 0.0;
      }
      else {
        local_104 = (float)(**(code **)(*(long *)local_10[0x6a9] + 8))
                                     ((long *)local_10[0x6a9],*local_10);
        local_104 = local_104 * local_30;
      }
      *local_20 = local_104;
      if (local_34 <= 0.0) {
        fVar4 = 0.0;
      }
      else {
        fVar4 = (float)(**(code **)(*(long *)local_10[0x6a9] + 8))
                                 ((long *)local_10[0x6a9],*local_10);
        fVar4 = fVar4 * local_34;
      }
      *local_20 = fVar4 + *local_20;
      *local_20 = *local_20 / (local_30 + local_34);
    }
    else {
      *local_20 = 1.1754944e-38;
    }
    local_1 = 1;
  }
  else {
    if ((*(byte *)(*local_10 + 0xd0) & 1) == 0) {
      iVar3 = std::__cxx11::string::compare((char *)local_58);
      if (iVar3 == 0) {
        *local_18 = (float)(~-(uint)(local_34 <= local_30) & 0x3f800000 |
                           -(uint)(local_34 <= local_30) & 0xbf800000);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_58);
        if (iVar3 == 0) {
          local_24 = -1.0;
          local_28 = 1.0;
          if (0.0 < local_30) {
            if (0.0 < local_34) {
              dVar5 = std::log((double)(ulong)(uint)(local_34 / local_30));
              *local_18 = SUB84(dVar5,0);
            }
            else {
              *local_18 = -1.0;
            }
          }
          else {
            *local_18 = 1.0;
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_58);
          if (((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)local_58), iVar3 != 0)
              ) && (iVar3 = std::__cxx11::string::compare((char *)local_58), iVar3 != 0)) {
            local_1 = 0;
            goto LAB_0031911e;
          }
          local_70 = 0.5;
          plVar1 = (long *)local_10[0x4f];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_90,"quantile_tau",&local_91);
          bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_90);
          std::__cxx11::string::~string(local_90);
          std::allocator<char>::~allocator((allocator<char> *)&local_91);
          if ((bVar2 & 1) != 0) {
            key = (string *)local_b9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)(local_b9 + 1),"quantile_tau",(allocator *)key);
            VW::config::options_i::get_typed_option<float>
                      ((options_i *)CONCAT17(bVar2,in_stack_ffffffffffffff20),key);
            local_70 = VW::config::typed_option<float>::value
                                 ((typed_option<float> *)
                                  CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
            std::__cxx11::string::~string((string *)(local_b9 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_b9);
          }
          if (local_34 <= local_70 * (local_30 + local_34)) {
            *local_18 = local_24;
          }
          else {
            *local_18 = local_28;
          }
        }
      }
      goto LAB_00318fb9;
    }
    local_1 = 0;
  }
LAB_0031911e:
  local_5c = 1;
  std::__cxx11::string::~string(local_58);
LAB_0031913c:
  return (bool)(local_1 & 1);
}

Assistant:

bool get_best_constant(vw& all, float& best_constant, float& best_constant_loss)
{
  if (all.sd->first_observed_label == FLT_MAX ||  // no non-test labels observed or function was never called
      (all.loss == nullptr) || (all.sd == nullptr))
    return false;

  float label1 = all.sd->first_observed_label;  // observed labels might be inside [sd->Min_label, sd->Max_label], so
                                                // can't use Min/Max
  float label2 = (all.sd->second_observed_label == FLT_MAX)
      ? 0
      : all.sd->second_observed_label;  // if only one label observed, second might be 0
  if (label1 > label2)
  {
    float tmp = label1;
    label1 = label2;
    label2 = tmp;
  }  // as don't use min/max - make sure label1 < label2

  float label1_cnt;
  float label2_cnt;

  if (label1 != label2)
  {
    label1_cnt = (float)(all.sd->weighted_labels - label2 * all.sd->weighted_labeled_examples) / (label1 - label2);
    label2_cnt = (float)all.sd->weighted_labeled_examples - label1_cnt;
  }
  else
    return false;

  if ((label1_cnt + label2_cnt) <= 0.)
    return false;

  auto funcName = all.loss->getType();
  if (funcName.compare("squared") == 0 || funcName.compare("Huber") == 0 || funcName.compare("classic") == 0)
    best_constant = (float)all.sd->weighted_labels / (float)(all.sd->weighted_labeled_examples);
  else if (all.sd->is_more_than_two_labels_observed)
  {
    // loss functions below don't have generic formuas for constant yet.
    return false;
  }
  else if (funcName.compare("hinge") == 0)
  {
    best_constant = label2_cnt <= label1_cnt ? -1.f : 1.f;
  }
  else if (funcName.compare("logistic") == 0)
  {
    label1 = -1.;  // override {-50, 50} to get proper loss
    label2 = 1.;

    if (label1_cnt <= 0)
      best_constant = 1.;
    else if (label2_cnt <= 0)
      best_constant = -1.;
    else
      best_constant = log(label2_cnt / label1_cnt);
  }
  else if (funcName.compare("quantile") == 0 || funcName.compare("pinball") == 0 || funcName.compare("absolute") == 0)
  {
    float tau = 0.5;

    if (all.options->was_supplied("quantile_tau"))
      tau = all.options->get_typed_option<float>("quantile_tau").value();

    float q = tau * (label1_cnt + label2_cnt);
    if (q < label2_cnt)
      best_constant = label2;
    else
      best_constant = label1;
  }
  else
    return false;

  if (!all.sd->is_more_than_two_labels_observed)
  {
    best_constant_loss = (label1_cnt > 0) ? all.loss->getLoss(all.sd, best_constant, label1) * label1_cnt : 0.0f;
    best_constant_loss += (label2_cnt > 0) ? all.loss->getLoss(all.sd, best_constant, label2) * label2_cnt : 0.0f;
    best_constant_loss /= label1_cnt + label2_cnt;
  }
  else
    best_constant_loss = FLT_MIN;

  return true;
}